

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_leaf.hpp
# Opt level: O0

bool __thiscall
duckdb::BaseLeaf<(unsigned_char)'\x0f',_(duckdb::NType)9>::GetNextByte
          (BaseLeaf<(unsigned_char)__x0f_,_(duckdb::NType)9> *this,uint8_t *byte)

{
  uint8_t i;
  uint8_t *byte_local;
  BaseLeaf<(unsigned_char)__x0f_,_(duckdb::NType)9> *this_local;
  
  i = '\0';
  while( true ) {
    if (this->count <= i) {
      return false;
    }
    if (*byte <= this->key[i]) break;
    i = i + '\x01';
  }
  *byte = this->key[i];
  return true;
}

Assistant:

bool GetNextByte(uint8_t &byte) const {
		for (uint8_t i = 0; i < count; i++) {
			if (key[i] >= byte) {
				byte = key[i];
				return true;
			}
		}
		return false;
	}